

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_stream::send_accept<libtorrent::aux::peer_connection::start()::__0>
          (i2p_stream *this,anon_class_16_1_898a5c2a *h)

{
  anon_class_16_1_898a5c2a *u;
  __0 local_1f0 [16];
  i2p_stream *local_1e0;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:414:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>
  local_1d8;
  mutable_buffer local_1c0;
  int local_1ac;
  char local_1a8 [4];
  int size;
  char cmd [400];
  anon_class_16_1_898a5c2a *h_local;
  i2p_stream *this_local;
  
  this->m_state = read_accept_response;
  cmd._392_8_ = h;
  local_1ac = snprintf(local_1a8,400,"STREAM ACCEPT ID=%s\n",this->m_id);
  local_1c0 = boost::asio::buffer<char,400ul>((char (*) [400])local_1a8,(long)local_1ac);
  u = (anon_class_16_1_898a5c2a *)local_1c0.data_;
  local_1e0 = this;
  libtorrent::aux::peer_connection::start()::$_0::__0(local_1f0,h);
  libtorrent::aux::
  wrap_allocator<libtorrent::i2p_stream::send_accept<libtorrent::aux::peer_connection::start()::__0>(libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>
            (&local_1d8,(aux *)local_1e0,(i2p_stream *)local_1f0,u);
  boost::asio::
  async_write<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::send_accept<libtorrent::aux::peer_connection::start()::__0>(libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>>
            ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)this,&local_1c0,&local_1d8,(type *)0x0);
  libtorrent::aux::
  wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:414:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>
  ::~wrap_allocator_t(&local_1d8);
  libtorrent::aux::peer_connection::start()::$_0::~__0(local_1f0);
  return;
}

Assistant:

void send_accept(Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		m_state = read_accept_response;
		char cmd[400];
		int size = std::snprintf(cmd, sizeof(cmd), "STREAM ACCEPT ID=%s\n", m_id);
		ADD_OUTSTANDING_ASYNC("i2p_stream::start_read_line");
		async_write(m_sock, boost::asio::buffer(cmd, std::size_t(size)), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				start_read_line(ec, std::move(hn));
			}, std::move(h)));
	}